

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QPersistentModelIndex,QHashDummyValue>::emplace_helper<QHashDummyValue_const&>
          (QHash<QPersistentModelIndex,_QHashDummyValue> *this,QPersistentModelIndex *key,
          QHashDummyValue *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  iterator<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *in_RDX;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
  findOrInsert<QPersistentModelIndex>(in_RSI,(QPersistentModelIndex *)in_RDX);
  QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::node(in_RDX);
  QHashPrivate::Node<QPersistentModelIndex,QHashDummyValue>::createInPlace<QHashDummyValue_const&>
            ((Node<QPersistentModelIndex,_QHashDummyValue> *)in_stack_ffffffffffffff90,
             (QPersistentModelIndex *)in_stack_ffffffffffffff88,(QHashDummyValue *)0x9054c3);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<QPersistentModelIndex,_QHashDummyValue>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }